

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

void __thiscall cmProcess::OnTimeout(cmProcess *this)

{
  bool bVar1;
  uv_process_s *puVar2;
  bool was_still_reading;
  cmProcess *this_local;
  
  if (this->ProcessState == Executing) {
    this->ProcessState = Expired;
    bVar1 = this->ReadHandleClosed;
    if ((this->ReadHandleClosed & 1U) == 0) {
      this->ReadHandleClosed = true;
      ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset
                ((uv_handle_ptr_base_<uv_pipe_s> *)&this->PipeReader);
    }
    if ((this->ProcessHandleClosed & 1U) == 0) {
      puVar2 = ::cm::uv_handle_ptr_base_<uv_process_s>::operator->
                         ((uv_handle_ptr_base_<uv_process_s> *)&this->Process);
      cmsysProcess_KillPID((long)puVar2->pid);
    }
    else if (((bVar1 ^ 0xffU) & 1) != 0) {
      cmCTestRunTest::FinalizeTest(this->Runner);
    }
  }
  return;
}

Assistant:

void cmProcess::OnTimeout()
{
  if (this->ProcessState != cmProcess::State::Executing) {
    return;
  }
  this->ProcessState = cmProcess::State::Expired;
  bool const was_still_reading = !this->ReadHandleClosed;
  if (!this->ReadHandleClosed) {
    this->ReadHandleClosed = true;
    this->PipeReader.reset();
  }
  if (!this->ProcessHandleClosed) {
    // Kill the child and let our on-exit handler finish the test.
    cmsysProcess_KillPID(static_cast<unsigned long>(this->Process->pid));
  } else if (was_still_reading) {
    // Our on-exit handler already ran but did not finish the test
    // because we were still reading output.  We've just dropped
    // our read handler, so we need to finish the test now.
    this->Runner.FinalizeTest();
  }
}